

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

bool wasm::ParamUtils::removeParameter
               (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,Index index,
               vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
               vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
               PassRunner *runner)

{
  pointer *this;
  pointer *pppFVar1;
  pointer ppFVar2;
  Call **ppCVar3;
  Function *pFVar4;
  Index *pIVar5;
  pointer ppCVar6;
  pointer puVar7;
  undefined1 auVar8 [16];
  PassRunner *pPVar9;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *pvVar10;
  bool bVar11;
  Type TVar12;
  ulong uVar13;
  pointer ppFVar14;
  pointer ppCVar15;
  pointer puVar16;
  pointer *__src;
  Index **ppIVar17;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  __it;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  __it_00;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  _Var18;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  _Var19;
  long lVar20;
  Iterator __first;
  Iterator start_it;
  Iterator start_it_00;
  Signature SVar21;
  Iterator __last;
  Iterator end_it;
  Iterator end_it_00;
  undefined1 local_1c0 [8];
  anon_class_24_3_97fb837d hasBadEffects;
  long lStack_1a0;
  long lStack_f0;
  Type local_c8;
  Type paramsType;
  PassRunner *runner_local;
  pointer local_b0;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *local_a8;
  Module *local_a0;
  Module *module_local;
  uint local_8c;
  HeapType local_88;
  Function *local_80;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *local_78;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndexes;
  Index local_34 [2];
  Index index_local;
  undefined7 extraout_var;
  
  ppFVar14 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  paramsType.id = (uintptr_t)runner;
  local_a0 = module;
  module_local = (Module *)callRefs;
  local_34[0] = index;
  if (ppFVar2 == ppFVar14) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                  ,0x36,
                  "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                 );
  }
  local_80 = *ppFVar14;
  do {
    if (((*ppFVar14)->type).id != (local_80->type).id) {
      __assert_fail("func->type == first->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0x3a,
                    "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                   );
    }
    ppFVar14 = ppFVar14 + 1;
  } while (ppFVar14 != ppFVar2);
  local_1c0 = (undefined1  [8])&paramsType;
  __range2 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)local_1c0;
  hasBadEffects.runner = (PassRunner **)&local_a0;
  hasBadEffects.module = (Module **)local_34;
  __it._M_current =
       (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  ppCVar3 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar20 = (long)ppCVar3 - (long)__it._M_current >> 5;
  local_a8 = calls;
  local_78 = funcs;
  if (0 < lVar20) {
    lVar20 = lVar20 + 1;
    do {
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                             *)&__range2,__it);
      _Var18._M_current = __it._M_current;
      if (bVar11) goto LAB_00621133;
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                             *)&__range2,
                            (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                             )(__it._M_current + 1));
      _Var18._M_current = __it._M_current + 1;
      if (bVar11) goto LAB_00621133;
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                             *)&__range2,
                            (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                             )(__it._M_current + 2));
      _Var18._M_current = __it._M_current + 2;
      if (bVar11) goto LAB_00621133;
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                             *)&__range2,
                            (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                             )(__it._M_current + 3));
      _Var18._M_current = __it._M_current + 3;
      if (bVar11) goto LAB_00621133;
      __it._M_current = __it._M_current + 4;
      lVar20 = lVar20 + -1;
    } while (1 < lVar20);
  }
  lVar20 = (long)ppCVar3 - (long)__it._M_current >> 3;
  if (lVar20 == 1) {
LAB_0062111e:
    bVar11 = __gnu_cxx::__ops::
             _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
             ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                           *)&__range2,__it);
    _Var18._M_current = __it._M_current;
    if (!bVar11) {
      _Var18._M_current = ppCVar3;
    }
  }
  else if (lVar20 == 2) {
LAB_0062110a:
    bVar11 = __gnu_cxx::__ops::
             _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
             ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                           *)&__range2,__it);
    _Var18._M_current = __it._M_current;
    if (!bVar11) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0062111e;
    }
  }
  else {
    _Var18._M_current = ppCVar3;
    if ((lVar20 == 3) &&
       (bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
                 ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                               *)&__range2,__it), _Var18._M_current = __it._M_current, !bVar11)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0062110a;
    }
  }
LAB_00621133:
  if (_Var18._M_current == ppCVar3) {
    __it_00._M_current =
         (CallRef **)
         (module_local->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    puVar16 = (module_local->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __range2 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)local_1c0;
    lVar20 = (long)puVar16 - (long)__it_00._M_current >> 5;
    if (0 < lVar20) {
      lVar20 = lVar20 + 1;
      do {
        bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
                 ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                               *)&__range2,__it_00);
        _Var19._M_current = __it_00._M_current;
        if (bVar11) goto LAB_00621227;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
                 ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                               *)&__range2,
                              (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                               )(__it_00._M_current + 1));
        _Var19._M_current = __it_00._M_current + 1;
        if (bVar11) goto LAB_00621227;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
                 ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                               *)&__range2,
                              (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                               )(__it_00._M_current + 2));
        _Var19._M_current = __it_00._M_current + 2;
        if (bVar11) goto LAB_00621227;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
                 ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                               *)&__range2,
                              (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                               )(__it_00._M_current + 3));
        _Var19._M_current = __it_00._M_current + 3;
        if (bVar11) goto LAB_00621227;
        __it_00._M_current = __it_00._M_current + 4;
        lVar20 = lVar20 + -1;
      } while (1 < lVar20);
    }
    lVar20 = (long)puVar16 - (long)__it_00._M_current >> 3;
    if (lVar20 == 1) {
LAB_00621212:
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                             *)&__range2,__it_00);
      _Var19._M_current = __it_00._M_current;
      if (!bVar11) {
        _Var19._M_current = (CallRef **)puVar16;
      }
    }
    else if (lVar20 == 2) {
LAB_006211fe:
      bVar11 = __gnu_cxx::__ops::
               _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
               ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                             *)&__range2,__it_00);
      _Var19._M_current = __it_00._M_current;
      if (!bVar11) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_00621212;
      }
    }
    else {
      _Var19._M_current = (CallRef **)puVar16;
      if ((lVar20 == 3) &&
         (bVar11 = __gnu_cxx::__ops::
                   _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
                   ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                                 *)&__range2,__it_00), _Var19._M_current = __it_00._M_current,
         !bVar11)) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_006211fe;
      }
    }
LAB_00621227:
    pFVar4 = local_80;
    if ((pointer)_Var19._M_current == puVar16) {
      TVar12 = Function::getLocalType(local_80,local_34[0]);
      bVar11 = TypeUpdating::canHandleAsLocal(TVar12);
      uVar13 = CONCAT71(extraout_var,bVar11);
      if (bVar11) {
        local_8c = (uint)uVar13;
        SVar21 = HeapType::getSignature(&pFVar4->type);
        local_c8 = SVar21.params.id;
        TVar12.id = wasm::Type::size(&local_c8);
        __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_c8;
        __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = TVar12.id
        ;
        __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_c8;
        std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)&__range2,__first,__last,
                   (allocator_type *)
                   &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pppFVar1 = &(__range2->
                    super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
                    .super__Vector_impl_data._M_start + local_34[0];
        __src = pppFVar1 + 1;
        local_80 = (Function *)*pppFVar1;
        if ((pointer)__src !=
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start) {
          memmove(&(__range2->
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl.
                   super__Vector_impl_data._M_start + local_34[0],__src,
                  (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)__src);
        }
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
        ppFVar14 = (local_78->
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_b0 = (local_78->
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        if (ppFVar14 != local_b0) {
          this = &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
          do {
            pFVar4 = *ppFVar14;
            Tuple::Tuple((Tuple *)this,(TypeList *)&__range2);
            wasm::Type::Type((Type *)&runner_local,(Tuple *)this);
            pPVar9 = runner_local;
            SVar21 = HeapType::getSignature(&pFVar4->type);
            SVar21.params.id = (uintptr_t)pPVar9;
            HeapType::HeapType(&local_88,SVar21);
            (pFVar4->type).id = CONCAT44(local_88.id._4_4_,(Index)local_88.id);
            if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)newIndexes.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::clear(&(pFVar4->localNames)._M_h);
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::clear(&(pFVar4->localIndices)._M_h);
            ppFVar14 = ppFVar14 + 1;
          } while (ppFVar14 != local_b0);
        }
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ppFVar14 = (local_78->
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppFVar2 = (local_78->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (ppFVar14 != ppFVar2) {
          do {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_80;
            local_88.id._0_4_ =
                 Builder::addVar((Builder *)*ppFVar14,(Function *)0x0,(Name)(auVar8 << 0x40),TVar12)
            ;
            if (newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,(iterator)0x0,(uint *)&local_88
                        );
            }
            else {
              *newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = (Index)local_88.id;
              newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
            }
            ppFVar14 = ppFVar14 + 1;
          } while (ppFVar14 != ppFVar2);
        }
        pvVar10 = local_78;
        ppFVar14 = (local_78->
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        if ((local_78->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
          uVar13 = 0;
          do {
            pFVar4 = ppFVar14[uVar13];
            if ((pFVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
              hasBadEffects.index = (Index *)0x0;
              lStack_1a0 = 0;
              lStack_f0 = 0;
              Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                        ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)
                         &hasBadEffects.index,
                         PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,
                         &pFVar4->body);
              while ((lStack_f0 >> 4) + lStack_1a0 != 0) {
                if (lStack_f0 == 0) {
                  if (lStack_1a0 == 0) {
                    __assert_fail("usedFixed > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                                  ,0x5a,
                                  "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                                 );
                  }
                  ppIVar17 = &hasBadEffects.index + lStack_1a0 * 2;
                }
                else {
                  ppIVar17 = (Index **)(lStack_f0 + -0x10);
                }
                pIVar5 = ppIVar17[1];
                if (lStack_f0 == 0) {
                  if (lStack_1a0 == 0) {
                    __assert_fail("usedFixed > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                                  ,0x51,
                                  "void wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::pop_back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                                 );
                  }
                  lStack_1a0 = lStack_1a0 + -1;
                }
                else {
                  lStack_f0 = lStack_f0 + -0x10;
                }
                hasBadEffects.index = pIVar5;
                if (*(long *)pIVar5 == 0) {
                  __assert_fail("*task.currp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                                ,0x139,
                                "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                               );
                }
                (*(code *)*ppIVar17)(&hasBadEffects.index);
              }
              TypeUpdating::handleNonDefaultableLocals(pFVar4,local_a0);
            }
            uVar13 = (ulong)((int)uVar13 + 1);
            ppFVar14 = (pvVar10->
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar13 < (ulong)((long)(pvVar10->
                                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppFVar14 >> 3));
        }
        ppCVar6 = (local_a8->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar15 = (local_a8->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                        _M_impl.super__Vector_impl_data._M_start; ppCVar15 != ppCVar6;
            ppCVar15 = ppCVar15 + 1) {
          end_it.parent = &(*ppCVar15)->operands;
          start_it.index._0_4_ = local_34[0];
          start_it.parent = end_it.parent;
          start_it.index._4_4_ = 0;
          end_it.index = (ulong)local_34[0] + 1;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                    (&(end_it.parent)->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     start_it,end_it);
        }
        puVar7 = (module_local->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar16 = (module_local->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar7;
            puVar16 = puVar16 + 1) {
          end_it_00.parent =
               &((puVar16->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->value;
          start_it_00.index._0_4_ = local_34[0];
          start_it_00.parent = (ArenaVector<wasm::Expression_*> *)end_it_00.parent;
          start_it_00.index._4_4_ = 0;
          end_it_00.index = (ulong)local_34[0] + 1;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     end_it_00.parent,start_it_00,end_it_00);
        }
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,
                          -(long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (__range2 != (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)0x0) {
          operator_delete(__range2,(long)params.
                                         super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)__range2
                         );
        }
        uVar13 = (ulong)local_8c;
      }
      goto LAB_0062122e;
    }
  }
  uVar13 = 0;
LAB_0062122e:
  return SUB81(uVar13,0);
}

Assistant:

bool removeParameter(const std::vector<Function*>& funcs,
                     Index index,
                     const std::vector<Call*>& calls,
                     const std::vector<CallRef*>& callRefs,
                     Module* module,
                     PassRunner* runner) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Check if none of the calls has a param with side effects that we cannot
  // remove (as if we can remove them, we will simply do that when we remove the
  // parameter). Note: flattening the IR beforehand can help here.
  //
  // It would also be bad if we remove a parameter that causes the type of the
  // call to change, like this:
  //
  //  (call $foo
  //    (unreachable))
  //
  // After removing the parameter the type should change from unreachable to
  // something concrete. We could handle this by updating the type and then
  // propagating that out, or by appending an unreachable after the call, but
  // for simplicity just ignore such cases; if we are called again later then
  // if DCE ran meanwhile then we could optimize.
  auto hasBadEffects = [&](auto* call) {
    auto& operands = call->operands;
    bool hasUnremovable =
      EffectAnalyzer(runner->options, *module, operands[index])
        .hasUnremovableSideEffects();
    bool wouldChangeType = call->type == Type::unreachable && !call->isReturn &&
                           operands[index]->type == Type::unreachable;
    return hasUnremovable || wouldChangeType;
  };
  bool callParamsAreValid =
    std::none_of(calls.begin(), calls.end(), [&](Call* call) {
      return hasBadEffects(call);
    });
  if (!callParamsAreValid) {
    return false;
  }
  bool callRefParamsAreValid =
    std::none_of(callRefs.begin(), callRefs.end(), [&](CallRef* call) {
      return hasBadEffects(call);
    });
  if (!callRefParamsAreValid) {
    return false;
  }

  // The type must be valid for us to handle as a local (since we
  // replace the parameter with a local).
  // TODO: if there are no references at all, we can avoid creating a
  //       local
  bool typeIsValid = TypeUpdating::canHandleAsLocal(first->getLocalType(index));
  if (!typeIsValid) {
    return false;
  }

  // We can do it!

  // Remove the parameter from the function. We must add a new local
  // for uses of the parameter, but cannot make it use the same index
  // (in general).
  auto paramsType = first->getParams();
  std::vector<Type> params(paramsType.begin(), paramsType.end());
  auto type = params[index];
  params.erase(params.begin() + index);
  // TODO: parallelize some of these loops?
  for (auto* func : funcs) {
    func->setParams(Type(params));

    // It's cumbersome to adjust local names - TODO don't clear them?
    Builder::clearLocalNames(func);
  }
  std::vector<Index> newIndexes;
  for (auto* func : funcs) {
    newIndexes.push_back(Builder::addVar(func, type));
  }
  // Update local operations.
  struct LocalUpdater : public PostWalker<LocalUpdater> {
    Index removedIndex;
    Index newIndex;
    LocalUpdater(Function* func, Index removedIndex, Index newIndex)
      : removedIndex(removedIndex), newIndex(newIndex) {
      walk(func->body);
    }
    void visitLocalGet(LocalGet* curr) { updateIndex(curr->index); }
    void visitLocalSet(LocalSet* curr) { updateIndex(curr->index); }
    void updateIndex(Index& index) {
      if (index == removedIndex) {
        index = newIndex;
      } else if (index > removedIndex) {
        index--;
      }
    }
  };
  for (Index i = 0; i < funcs.size(); i++) {
    auto* func = funcs[i];
    if (!func->imported()) {
      LocalUpdater(funcs[i], index, newIndexes[i]);
      TypeUpdating::handleNonDefaultableLocals(func, *module);
    }
  }

  // Remove the arguments from the calls.
  for (auto* call : calls) {
    call->operands.erase(call->operands.begin() + index);
  }
  for (auto* call : callRefs) {
    call->operands.erase(call->operands.begin() + index);
  }

  return true;
}